

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_reassemble_dtls_handshake(mbedtls_ssl_context *ssl)

{
  int iVar1;
  ulong len;
  size_t sVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t remain_len;
  uchar *new_remain;
  uchar *cur_remain;
  size_t alloc_len;
  size_t msg_len;
  size_t frag_off;
  size_t frag_len;
  uchar *bitmask;
  uchar *msg;
  mbedtls_ssl_context *ssl_local;
  
  sVar5 = ssl->in_hslen;
  len = sVar5 - 0xc;
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xb6d,"not supported outside handshake (for now)");
    return -0x7080;
  }
  if (ssl->handshake->hs_msg == (uchar *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xb79,"initialize reassembly, total length = %d",len);
    if (0x4000 < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb7d,"handshake message too large");
      return -0x7080;
    }
    sVar2 = sVar5 + (len >> 3) + (long)(int)(uint)((len & 7) != 0);
    puVar3 = (uchar *)calloc(1,sVar2);
    ssl->handshake->hs_msg = puVar3;
    if (ssl->handshake->hs_msg == (uchar *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb87,"alloc failed (%d bytes)",sVar2);
      return -0x7f00;
    }
    puVar3 = ssl->handshake->hs_msg;
    puVar4 = ssl->in_msg;
    *(undefined4 *)puVar3 = *(undefined4 *)puVar4;
    *(undefined2 *)(puVar3 + 4) = *(undefined2 *)(puVar4 + 4);
    memset(ssl->handshake->hs_msg + 6,0,3);
    puVar3 = ssl->handshake->hs_msg;
    puVar4 = ssl->handshake->hs_msg;
    *(undefined2 *)(puVar3 + 9) = *(undefined2 *)(puVar4 + 1);
    puVar3[0xb] = puVar4[3];
  }
  else if (*(int *)ssl->handshake->hs_msg != *(int *)ssl->in_msg) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xb97,"fragment header mismatch");
    return -0x7200;
  }
  puVar3 = ssl->handshake->hs_msg;
  puVar4 = puVar3 + sVar5;
  sVar5 = (size_t)(int)((uint)ssl->in_msg[6] << 0x10 | (uint)ssl->in_msg[7] << 8 |
                       (uint)ssl->in_msg[8]);
  sVar2 = (size_t)(int)((uint)ssl->in_msg[9] << 0x10 | (uint)ssl->in_msg[10] << 8 |
                       (uint)ssl->in_msg[0xb]);
  if (len < sVar5 + sVar2) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbac,"invalid fragment offset/len: %d + %d > %d",sVar5,sVar2,len);
    ssl_local._4_4_ = -0x7200;
  }
  else if (ssl->in_msglen < sVar2 + 0xc) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbb3,"invalid fragment length: %d + 12 > %d",sVar2,ssl->in_msglen);
    ssl_local._4_4_ = -0x7200;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,3000,"adding fragment, offset = %d, length = %d",sVar5,sVar2);
    memcpy(puVar3 + sVar5 + 0xc,ssl->in_msg + 0xc,sVar2);
    ssl_bitmask_set(puVar4,sVar5,sVar2);
    iVar1 = ssl_bitmask_check(puVar4,len);
    if (iVar1 == 0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xbc7,"handshake message completed");
      if (sVar2 + 0xc < ssl->in_msglen) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xbd0,"last fragment not alone in its record");
        ssl_local._4_4_ = -0x7080;
      }
      else {
        if (ssl->next_record_offset < ssl->in_left) {
          sVar5 = ssl->next_record_offset;
          sVar2 = ssl->in_left - ssl->next_record_offset;
          ssl->next_record_offset = (long)(ssl->in_msg + ssl->in_hslen) - (long)ssl->in_hdr;
          ssl->in_left = ssl->next_record_offset + sVar2;
          if (0x414dU - ((long)ssl->in_hdr - (long)ssl->in_buf) < ssl->in_left) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0xbe6,"reassembled message too large for buffer");
            return -0x6a00;
          }
          memmove(ssl->in_msg + ssl->in_hslen,ssl->in_hdr + sVar5,sVar2);
        }
        memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
        free(ssl->handshake->hs_msg);
        ssl->handshake->hs_msg = (uchar *)0x0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xbf3,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
        ssl_local._4_4_ = 0;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xbc3,"message is not complete yet");
      ssl_local._4_4_ = -0x6900;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_reassemble_dtls_handshake( mbedtls_ssl_context *ssl )
{
    unsigned char *msg, *bitmask;
    size_t frag_len, frag_off;
    size_t msg_len = ssl->in_hslen - 12; /* Without headers */

    if( ssl->handshake == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "not supported outside handshake (for now)" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * For first fragment, check size and allocate buffer
     */
    if( ssl->handshake->hs_msg == NULL )
    {
        size_t alloc_len;

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "initialize reassembly, total length = %d",
                            msg_len ) );

        if( ssl->in_hslen > MBEDTLS_SSL_MAX_CONTENT_LEN )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too large" ) );
            return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
        }

        /* The bitmask needs one bit per byte of message excluding header */
        alloc_len = 12 + msg_len + msg_len / 8 + ( msg_len % 8 != 0 );

        ssl->handshake->hs_msg = mbedtls_calloc( 1, alloc_len );
        if( ssl->handshake->hs_msg == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc failed (%d bytes)", alloc_len ) );
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
        }

        /* Prepare final header: copy msg_type, length and message_seq,
         * then add standardised fragment_offset and fragment_length */
        memcpy( ssl->handshake->hs_msg, ssl->in_msg, 6 );
        memset( ssl->handshake->hs_msg + 6, 0, 3 );
        memcpy( ssl->handshake->hs_msg + 9,
                ssl->handshake->hs_msg + 1, 3 );
    }
    else
    {
        /* Make sure msg_type and length are consistent */
        if( memcmp( ssl->handshake->hs_msg, ssl->in_msg, 4 ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "fragment header mismatch" ) );
            return( MBEDTLS_ERR_SSL_INVALID_RECORD );
        }
    }

    msg = ssl->handshake->hs_msg + 12;
    bitmask = msg + msg_len;

    /*
     * Check and copy current fragment
     */
    frag_off = ( ssl->in_msg[6]  << 16 ) |
               ( ssl->in_msg[7]  << 8  ) |
                 ssl->in_msg[8];
    frag_len = ( ssl->in_msg[9]  << 16 ) |
               ( ssl->in_msg[10] << 8  ) |
                 ssl->in_msg[11];

    if( frag_off + frag_len > msg_len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid fragment offset/len: %d + %d > %d",
                          frag_off, frag_len, msg_len ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    if( frag_len + 12 > ssl->in_msglen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid fragment length: %d + 12 > %d",
                          frag_len, ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "adding fragment, offset = %d, length = %d",
                        frag_off, frag_len ) );

    memcpy( msg + frag_off, ssl->in_msg + 12, frag_len );
    ssl_bitmask_set( bitmask, frag_off, frag_len );

    /*
     * Do we have the complete message by now?
     * If yes, finalize it, else ask to read the next record.
     */
    if( ssl_bitmask_check( bitmask, msg_len ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "message is not complete yet" ) );
        return( MBEDTLS_ERR_SSL_WANT_READ );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake message completed" ) );

    if( frag_len + 12 < ssl->in_msglen )
    {
        /*
         * We'got more handshake messages in the same record.
         * This case is not handled now because no know implementation does
         * that and it's hard to test, so we prefer to fail cleanly for now.
         */
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "last fragment not alone in its record" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    if( ssl->in_left > ssl->next_record_offset )
    {
        /*
         * We've got more data in the buffer after the current record,
         * that we don't want to overwrite. Move it before writing the
         * reassembled message, and adjust in_left and next_record_offset.
         */
        unsigned char *cur_remain = ssl->in_hdr + ssl->next_record_offset;
        unsigned char *new_remain = ssl->in_msg + ssl->in_hslen;
        size_t remain_len = ssl->in_left - ssl->next_record_offset;

        /* First compute and check new lengths */
        ssl->next_record_offset = new_remain - ssl->in_hdr;
        ssl->in_left = ssl->next_record_offset + remain_len;

        if( ssl->in_left > MBEDTLS_SSL_BUFFER_LEN -
                           (size_t)( ssl->in_hdr - ssl->in_buf ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "reassembled message too large for buffer" ) );
            return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
        }

        memmove( new_remain, cur_remain, remain_len );
    }

    memcpy( ssl->in_msg, ssl->handshake->hs_msg, ssl->in_hslen );

    mbedtls_free( ssl->handshake->hs_msg );
    ssl->handshake->hs_msg = NULL;

    MBEDTLS_SSL_DEBUG_BUF( 3, "reassembled handshake message",
                   ssl->in_msg, ssl->in_hslen );

    return( 0 );
}